

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void ossl_closeone(Curl_easy *data,connectdata *conn,ssl_connect_data *connssl)

{
  undefined1 local_48 [8];
  char buf [32];
  ssl_backend_data *backend;
  ssl_connect_data *connssl_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  buf._24_8_ = connssl->backend;
  if (((ssl_backend_data *)buf._24_8_)->handle != (SSL *)0x0) {
    (conn->ssl[0].backend)->logger = data;
    SSL_read((SSL *)((ssl_backend_data *)buf._24_8_)->handle,local_48,0x20);
    SSL_shutdown(*(SSL **)(buf._24_8_ + 0x10));
    SSL_set_connect_state(*(SSL **)(buf._24_8_ + 0x10));
    SSL_free(*(SSL **)(buf._24_8_ + 0x10));
    *(undefined8 *)(buf._24_8_ + 0x10) = 0;
  }
  if (*(long *)(buf._24_8_ + 8) != 0) {
    SSL_CTX_free(*(SSL_CTX **)(buf._24_8_ + 8));
    *(undefined8 *)(buf._24_8_ + 8) = 0;
  }
  return;
}

Assistant:

static void ossl_closeone(struct Curl_easy *data,
                          struct connectdata *conn,
                          struct ssl_connect_data *connssl)
{
  struct ssl_backend_data *backend = connssl->backend;

  DEBUGASSERT(backend);

  if(backend->handle) {
    char buf[32];
    set_logger(conn, data);
    /*
     * The conn->sock[0] socket is passed to openssl with SSL_set_fd().  Make
     * sure the socket is not closed before calling OpenSSL functions that
     * will use it.
     */
    DEBUGASSERT(conn->sock[FIRSTSOCKET] != CURL_SOCKET_BAD);

    /* Maybe the server has already sent a close notify alert.
       Read it to avoid an RST on the TCP connection. */
    (void)SSL_read(backend->handle, buf, (int)sizeof(buf));

    (void)SSL_shutdown(backend->handle);
    SSL_set_connect_state(backend->handle);

    SSL_free(backend->handle);
    backend->handle = NULL;
  }
  if(backend->ctx) {
    SSL_CTX_free(backend->ctx);
    backend->ctx = NULL;
  }
}